

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmq.hpp
# Opt level: O1

void __thiscall
rmq<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
::rmq(rmq<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
      *this,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            begin,
     __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
     end,unsigned_long superblock_size,unsigned_long block_size)

{
  ulong *puVar1;
  ushort uVar2;
  long *plVar3;
  long *plVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer puVar7;
  difference_type __d;
  ulong *puVar8;
  unsigned_long uVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong uVar12;
  long lVar13;
  size_type __n;
  ulong *puVar14;
  ushort uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong *puVar20;
  pointer puVar21;
  long lVar22;
  ulong *puVar23;
  ulong uVar24;
  ulong *puVar25;
  unsigned_long uVar26;
  rmq<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  *prVar27;
  allocator_type local_c9;
  ulong *local_c8;
  rmq<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  *local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  vector<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::vector<unsigned_short,std::allocator<unsigned_short>>>>
  *local_a0;
  vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
  *local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  unsigned_long local_78;
  pointer local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  unsigned_long local_38;
  
  (this->_begin)._M_current = begin._M_current;
  (this->_end)._M_current = end._M_current;
  this->superblock_size = superblock_size;
  this->block_size = block_size;
  (this->superblock_mins).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->superblock_mins).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->superblock_mins).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->block_mins).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->block_mins).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->block_mins).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8 = begin._M_current;
  if ((long)end._M_current - (long)begin._M_current == -8) {
    __assert_fail("(index_t)std::distance(begin, end) < std::numeric_limits<index_t>::max()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0x50,
                  "rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                 );
  }
  uVar9 = (long)end._M_current - (long)begin._M_current >> 3;
  this->n = uVar9;
  if (superblock_size % block_size != 0) {
    __assert_fail("superblock_size % block_size == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0x55,
                  "rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                 );
  }
  uVar10 = uVar9 - 1;
  __n = uVar10 / superblock_size + 1;
  this->n_superblocks = __n;
  this->n_blocks = uVar10 / block_size + 1;
  this->n_blocks_per_superblock = superblock_size / block_size;
  if (superblock_size - 0x10001 < 0xffffffffffff0000) {
    __assert_fail("superblock_size-1 <= std::numeric_limits<uint16_t>::max()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0x5c,
                  "rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                 );
  }
  local_a0 = (vector<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::vector<unsigned_short,std::allocator<unsigned_short>>>>
              *)&this->block_mins;
  local_98 = (vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              *)&this->superblock_mins;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_b8,__n,&local_c9);
  std::
  vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
  ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              *)&this->superblock_mins,&local_b8);
  if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_b8,this->n_blocks,
             (allocator_type *)&local_c9);
  std::
  vector<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::vector<unsigned_short,std::allocator<unsigned_short>>>>
  ::emplace_back<std::vector<unsigned_short,std::allocator<unsigned_short>>>
            (local_a0,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_b8);
  local_c0 = this;
  if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8 != end._M_current) {
    plVar3 = *(long **)local_98;
    puVar11 = local_c8;
    do {
      uVar10 = (long)end._M_current - (long)puVar11 >> 3;
      if (superblock_size <= uVar10) {
        uVar10 = superblock_size;
      }
      puVar1 = puVar11 + uVar10;
      puVar14 = puVar11;
      if (end._M_current != puVar11) {
        plVar4 = *(long **)local_a0;
        puVar8 = puVar11;
        do {
          uVar10 = (long)end._M_current - (long)puVar8 >> 3;
          if (block_size <= uVar10) {
            uVar10 = block_size;
          }
          puVar20 = puVar8;
          if (0xf < uVar10 * 8) {
            lVar16 = uVar10 * 8 - 8;
            puVar25 = puVar8;
            puVar23 = puVar8;
            do {
              puVar23 = puVar23 + 1;
              puVar20 = puVar23;
              if (*puVar25 <= *puVar23) {
                puVar20 = puVar25;
              }
              lVar16 = lVar16 + -8;
              puVar25 = puVar20;
            } while (lVar16 != 0);
          }
          uVar17 = (long)puVar20 - (long)puVar11 >> 3;
          if (superblock_size <= uVar17) {
            __assert_fail("block_min_idx < superblock_size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                          ,0x73,
                          "rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                         );
          }
          puVar23 = puVar8 + uVar10;
          if (*puVar20 < *puVar14) {
            puVar14 = puVar20;
          }
          *(short *)(*plVar4 + ((ulong)((long)puVar8 - (long)local_c8 >> 3) / block_size) * 2) =
               (short)uVar17;
          puVar8 = puVar23;
        } while (puVar23 != puVar1);
      }
      *(long *)(*plVar3 + ((ulong)((long)puVar11 - (long)local_c8 >> 3) / superblock_size) * 8) =
           (long)puVar14 - (long)local_c8 >> 3;
      puVar11 = puVar1;
    } while (puVar1 != end._M_current);
  }
  uVar10 = local_c0->n_superblocks;
  prVar27 = local_c0;
  local_78 = superblock_size;
  if (1 < uVar10) {
    uVar24 = 1;
    lVar16 = 1;
    uVar17 = 2;
    do {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_b8,uVar10 - uVar24,&local_c9);
      std::
      vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
      ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>(local_98,&local_b8);
      if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar10 = prVar27->n_superblocks;
      if (uVar24 < uVar10) {
        pvVar5 = (prVar27->superblock_mins).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar6 = (prVar27->superblock_mins).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar22 = *(long *)&pvVar5[lVar16 + -1].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data;
        lVar13 = ((long)pvVar6 - (long)pvVar5 >> 3) * -0x5555555555555555;
        uVar18 = 0;
        do {
          uVar10 = uVar10 + ~(uVar17 >> 2);
          if (uVar24 + uVar18 <= uVar10) {
            uVar10 = uVar24 + uVar18;
          }
          uVar9 = *(unsigned_long *)(lVar22 + uVar18 * 8);
          uVar26 = *(unsigned_long *)(lVar22 + uVar10 * 8);
          if (local_c8[uVar9] < local_c8[uVar26]) {
            puVar21 = pvVar6[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)pvVar6[-1].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar21 >> 3) <=
                uVar18) {
              __assert_fail("i < superblock_mins.back().size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                            ,0x82,
                            "rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                           );
            }
            uVar26 = uVar9;
            if (lVar13 - (lVar16 + 1) != 0) {
              __assert_fail("superblock_mins.size() == level+1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                            ,0x83,
                            "rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                           );
            }
          }
          else {
            puVar21 = pvVar6[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)pvVar6[-1].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar21 >> 3) <=
                uVar18) {
              __assert_fail("i < superblock_mins.back().size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                            ,0x86,
                            "rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                           );
            }
            if (lVar13 - (lVar16 + 1) != 0) {
              __assert_fail("superblock_mins.size() == level+1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                            ,0x87,
                            "rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                           );
            }
            if ((ulong)((long)*(pointer *)
                               ((long)&pvVar5[lVar16 + -1].
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar22 >> 3) <=
                uVar10) {
              __assert_fail("superblock_mins[level-1].size() > right_idx",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                            ,0x88,
                            "rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                           );
            }
          }
          puVar21[uVar18] = uVar26;
          uVar10 = local_c0->n_superblocks;
          lVar19 = uVar24 + uVar18;
          uVar18 = uVar18 + 1;
          prVar27 = local_c0;
        } while (lVar19 + 1U < uVar10);
      }
      lVar16 = lVar16 + 1;
      uVar24 = uVar17 & 0x7ffffffffffffffe;
      uVar10 = prVar27->n_superblocks;
      uVar17 = uVar17 * 2;
    } while (uVar24 < uVar10);
  }
  uVar17 = prVar27->n_blocks;
  uVar24 = prVar27->n_blocks_per_superblock;
  uVar18 = uVar17;
  if (uVar24 < uVar17) {
    uVar18 = uVar24;
  }
  if (1 < uVar18) {
    local_80 = uVar17 - (uVar10 - 1) * uVar24;
    uVar10 = 2;
    uVar18 = 1;
    local_90 = 1;
    do {
      if (uVar17 == prVar27->n_superblocks * uVar10 >> 1) {
        return;
      }
      lVar16 = local_80 - uVar18;
      if (local_80 < uVar18) {
        lVar16 = 0;
      }
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_b8,
                 (uVar24 - uVar18) * (prVar27->n_superblocks - 1) + lVar16,
                 (allocator_type *)&local_c9);
      std::
      vector<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::vector<unsigned_short,std::allocator<unsigned_short>>>>
      ::emplace_back<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                (local_a0,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_b8);
      local_88 = uVar10;
      if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      local_38 = prVar27->n_superblocks;
      if (local_38 != 0) {
        local_40 = local_c0->n_blocks;
        local_48 = local_c0->n_blocks_per_superblock;
        uVar10 = local_88 >> 2;
        local_60 = local_48 - uVar10;
        local_68 = ~uVar10;
        local_70 = (local_c0->block_mins).
                   super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_90;
        local_58 = local_48 * 2 + uVar18 * -2;
        local_50 = local_48 * 2 + uVar10 * -2;
        lVar22 = 0;
        lVar16 = 0;
        uVar9 = 0;
        uVar10 = local_40;
        do {
          uVar17 = uVar10;
          if (local_48 < uVar10) {
            uVar17 = local_48;
          }
          uVar24 = local_40 - local_48 * uVar9;
          if (local_48 < uVar24) {
            uVar24 = local_48;
          }
          if (uVar18 < uVar24) {
            lVar13 = *(long *)&local_70[-1].
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data;
            puVar7 = (local_c0->block_mins).
                     super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar19 = 0;
            do {
              uVar12 = uVar18 + lVar19;
              if (uVar24 + local_68 < uVar18 + lVar19) {
                uVar12 = uVar24 + local_68;
              }
              uVar15 = *(ushort *)(lVar13 + lVar22 + lVar19 * 2);
              uVar2 = *(ushort *)(lVar13 + local_60 * uVar9 * 2 + uVar12 * 2);
              if (local_c8[uVar9 * local_78 + (ulong)uVar2] <=
                  local_c8[uVar9 * local_78 + (ulong)uVar15]) {
                uVar15 = uVar2;
              }
              *(ushort *)((long)puVar7 + lVar19 * 2 + lVar16) = uVar15;
              lVar19 = lVar19 + 1;
            } while ((uVar18 - uVar17) + lVar19 != 0);
          }
          uVar9 = uVar9 + 1;
          uVar10 = uVar10 - local_48;
          lVar16 = lVar16 + local_58;
          lVar22 = lVar22 + local_50;
        } while (uVar9 != local_38);
      }
      local_90 = local_90 + 1;
      uVar10 = local_88 * 2;
      uVar18 = local_88 & 0x7ffffffffffffffe;
      uVar17 = local_c0->n_blocks;
      uVar24 = local_c0->n_blocks_per_superblock;
      uVar12 = uVar17;
      if (uVar24 < uVar17) {
        uVar12 = uVar24;
      }
      prVar27 = local_c0;
    } while (uVar18 < uVar12);
  }
  return;
}

Assistant:

rmq(Iterator begin, Iterator end,
        index_t superblock_size = DEFAULT_SUPERBLOCK_SIZE,
        index_t block_size = DEFAULT_BLOCK_SIZE)
        : _begin(begin), _end(end), superblock_size(superblock_size), block_size(block_size)
    {
        // get size
        assert((index_t)std::distance(begin, end) < std::numeric_limits<index_t>::max());
        n = std::distance(begin, end);


        // superblock size should be divisable by block size
        assert(superblock_size % block_size == 0);

        // get number of blocks
        n_superblocks = (n-1) / superblock_size + 1;
        n_blocks = (n-1) / block_size + 1;
        n_blocks_per_superblock = superblock_size / block_size;

        assert(superblock_size-1 <= std::numeric_limits<uint16_t>::max());


        // start by finding index of mins per block
        // for each superblock
        superblock_mins.push_back(std::vector<index_t>(n_superblocks));
        block_mins.push_back(std::vector<uint16_t>(n_blocks));
        Iterator it = begin;
        while (it != end) {
            // find index of minimum block in superblock
            Iterator min_pos = it;
            Iterator sb_end_it = it;
            std::advance(sb_end_it, std::min<std::size_t>(std::distance(it, end), superblock_size));
            for (Iterator block_it = it; block_it != sb_end_it; ) {
                Iterator block_end_it = block_it;
                std::advance(block_end_it, std::min<std::size_t>(std::distance(block_it, end), block_size));
                Iterator block_min_pos = std::min_element(block_it, block_end_it);
                // save minimum for superblock min
                if (*block_min_pos < *min_pos) {
                    min_pos = block_min_pos;
                }
                // save minimum for block min, relative to superblock start
                index_t block_min_idx = static_cast<index_t>(std::distance(it, block_min_pos));
                assert(block_min_idx < superblock_size);
                block_mins[0][std::distance(begin, block_it) / block_size] = static_cast<uint16_t>(block_min_idx);
                block_it = block_end_it;
            }
            superblock_mins[0][std::distance(begin, it) / superblock_size] = static_cast<index_t>(std::distance(begin, min_pos));
            it = sb_end_it;
        }

        // fill superblock lookup with dynamic programming
        index_t level = 1;
        for (index_t dist = 2; dist/2 < n_superblocks; dist <<= 1) {
            superblock_mins.push_back(std::vector<index_t>(n_superblocks - dist/2));
            for (index_t i = 0; i+dist/2 < n_superblocks; ++i) {
                index_t right_idx = std::min(i+dist/2, n_superblocks-dist/4-1);
                if (*(begin + superblock_mins[level-1][i]) < *(begin + superblock_mins[level-1][right_idx])) {
                    assert(i < superblock_mins.back().size());
                    assert(superblock_mins.size() == level+1);
                    superblock_mins.back()[i] = superblock_mins[level-1][i];
                } else {
                    assert(i < superblock_mins.back().size());
                    assert(superblock_mins.size() == level+1);
                    assert(superblock_mins[level-1].size() > right_idx);
                    superblock_mins.back()[i] = superblock_mins[level-1][right_idx];
                }
            }
            level++;
        }

        // now the same thing for blocks (but index relative to their
        // superblock)
        level = 1;
        index_t last_sb_nblocks = n_blocks - (n_superblocks-1)*n_blocks_per_superblock;
        for (index_t dist = 2; dist/2 < std::min(n_blocks,n_blocks_per_superblock); dist <<= 1) {
            if (n_blocks - n_superblocks*dist/2 == 0)
                break;
            index_t last_sb_cur_nblocks = 0;
            if (last_sb_nblocks > dist/2)
                last_sb_cur_nblocks = last_sb_nblocks - dist/2;
            block_mins.push_back(std::vector<uint16_t>((n_superblocks-1)*(n_blocks_per_superblock - dist/2) + last_sb_cur_nblocks));
            for (index_t sb = 0; sb < n_superblocks; ++sb) {
                index_t pre_sb_offset = sb*(n_blocks_per_superblock - dist/4);
                index_t sb_offset = sb*(n_blocks_per_superblock - dist/2);
                index_t blocks_in_sb = std::min(n_blocks - sb*n_blocks_per_superblock, n_blocks_per_superblock);
                for (index_t i = 0; i+dist/2 < blocks_in_sb; ++i) {
                    // TODO: right_idx might become negative for last superblock??
                    index_t right_idx = std::min(i + dist/2, blocks_in_sb-dist/4-1);
                    if (*(begin + block_mins[level-1][i        +pre_sb_offset] + sb*superblock_size)
                      < *(begin + block_mins[level-1][right_idx+pre_sb_offset] + sb*superblock_size))
                    {
                        block_mins.back()[i+sb_offset] = block_mins[level-1][i+pre_sb_offset];
                    } else {
                        block_mins.back()[i+sb_offset] = block_mins[level-1][right_idx+pre_sb_offset];
                    }
                }
            }
            level++;
        }

        //assert(check_superblock_correctness());
        //assert(check_block_correctness());
    }